

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_x86_avx2.cpp
# Opt level: O2

void ncnn::cast_fp32_to_bf16_sse_avx2(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  undefined1 (*pauVar13) [32];
  undefined1 (*pauVar14) [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  
  iVar8 = bottom_blob->h * bottom_blob->w * bottom_blob->d * bottom_blob->elempack;
  uVar10 = 0;
  uVar9 = (ulong)(uint)bottom_blob->c;
  if (bottom_blob->c < 1) {
    uVar9 = uVar10;
  }
  for (; uVar10 != uVar9; uVar10 = uVar10 + 1) {
    pvVar1 = bottom_blob->data;
    sVar2 = bottom_blob->elemsize;
    sVar3 = bottom_blob->cstep;
    pauVar13 = (undefined1 (*) [32])(sVar3 * uVar10 * sVar2 + (long)pvVar1);
    pvVar4 = top_blob->data;
    sVar5 = top_blob->elemsize;
    sVar6 = top_blob->cstep;
    pauVar14 = (undefined1 (*) [32])(sVar6 * uVar10 * sVar5 + (long)pvVar4);
    lVar12 = 0;
    for (iVar11 = 0; iVar11 + 0xf < iVar8; iVar11 = iVar11 + 0x10) {
      auVar15 = vpsrld_avx2(*pauVar13,0x10);
      auVar16 = vpsrld_avx2(pauVar13[1],0x10);
      auVar15 = vpackusdw_avx2(auVar15,auVar16);
      auVar15 = vpermq_avx2(auVar15,0xd8);
      *pauVar14 = auVar15;
      pauVar13 = pauVar13 + 2;
      pauVar14 = pauVar14 + 1;
      lVar12 = lVar12 + 0x10;
    }
    for (; iVar11 + 7 < iVar8; iVar11 = iVar11 + 8) {
      auVar15 = vpsrld_avx2(*pauVar13,0x10);
      auVar7 = vpackusdw_avx(auVar15._0_16_,auVar15._16_16_);
      *(undefined1 (*) [16])*pauVar14 = auVar7;
      pauVar13 = pauVar13 + 1;
      pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
      lVar12 = lVar12 + 8;
    }
    for (; (int)lVar12 < iVar8; lVar12 = lVar12 + 1) {
      *(undefined2 *)((long)pvVar4 + lVar12 * 2 + sVar6 * sVar5 * uVar10) =
           *(undefined2 *)((long)pvVar1 + lVar12 * 4 + sVar3 * sVar2 * uVar10 + 2);
    }
  }
  return;
}

Assistant:

void cast_bf16_to_fp32_sse_avx2(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
    cast_bf16_to_fp32_sse(bottom_blob, top_blob, opt);
}